

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::EnumStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this_00;
  uint uVar2;
  SQInteger SVar3;
  SQObjectValue SVar4;
  SQObjectValue SVar5;
  SQObject SVar6;
  SQObject SVar7;
  SQObjectPtr strongid;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQLexer *local_60;
  SQObjectType local_58;
  SQObjectType local_54;
  SQObjectValue local_50;
  SQObjectPtr local_48;
  SQObjectValue local_38;
  
  local_60 = &this->_lex;
  SVar3 = SQLexer::Lex(local_60);
  this->_token = SVar3;
  SVar6 = Expect(this,0x102);
  local_38 = SVar6._unVal;
  local_54 = SVar6._type;
  Expect(this,0x7b);
  SVar6 = SQFuncState::CreateTable(this->_fs);
  local_50 = SVar6._unVal;
  local_58 = SVar6._type;
  if (this->_token != 0x7d) {
    SVar4.pTable = (SQTable *)0x0;
    do {
      SVar6 = Expect(this,0x102);
      if (this->_token == 0x3d) {
        SVar3 = SQLexer::Lex(local_60);
        this->_token = SVar3;
        SVar7 = ExpectScalar(this);
        SVar5 = SVar4;
      }
      else {
        SVar5.pTable = (SQTable *)
                       ((long)&((SVar4.pTable)->super_SQDelegable).super_SQCollectable.
                               super_SQRefCounted._vptr_SQRefCounted + 1);
        SVar7._unVal.pTable = SVar4.pTable;
        SVar7._0_8_ = 0x5000002;
      }
      local_70.super_SQObject._unVal = SVar7._unVal;
      if ((SVar6._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar6._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_70.super_SQObject._type = SVar7._type;
      if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_80.super_SQObject._type = SVar6._type;
      local_80.super_SQObject._unVal.nInteger = SVar6._unVal.nInteger;
      SQTable::NewSlot(local_50.pTable,&local_80,&local_70);
      SQObjectPtr::~SQObjectPtr(&local_70);
      SQObjectPtr::~SQObjectPtr(&local_80);
      if (this->_token == 0x2c) {
        SVar3 = SQLexer::Lex(local_60);
        this->_token = SVar3;
      }
      SVar4 = SVar5;
    } while (this->_token != 0x7d);
  }
  this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
  local_80.super_SQObject._type = local_54;
  local_80.super_SQObject._unVal.pTable = local_38.pTable;
  if ((local_54 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_38.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_70.super_SQObject._type = local_54;
  local_70.super_SQObject._unVal.pTable = local_38.pTable;
  if ((local_54 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_38.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_48.super_SQObject._type = local_58;
  local_48.super_SQObject._unVal.pTable = local_50.pTable;
  if ((local_58 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_50.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQTable::NewSlot(this_00,&local_70,&local_48);
  SQObjectPtr::~SQObjectPtr(&local_48);
  SQObjectPtr::~SQObjectPtr(&local_70);
  SVar4 = local_80.super_SQObject._unVal;
  uVar2 = local_80.super_SQObject._type >> 0x1b;
  local_80.super_SQObject._type = OT_NULL;
  local_80.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((uVar2 & 1) != 0) {
    pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
        _vptr_SQRefCounted[2])();
    }
  }
  SVar3 = SQLexer::Lex(local_60);
  this->_token = SVar3;
  SQObjectPtr::~SQObjectPtr(&local_80);
  return;
}

Assistant:

void EnumStatement()
    {
        Lex();
        SQObject id = Expect(TK_IDENTIFIER);
        Expect(_SC('{'));

        SQObject table = _fs->CreateTable();
        SQInteger nval = 0;
        while(_token != _SC('}')) {
            SQObject key = Expect(TK_IDENTIFIER);
            SQObject val;
            if(_token == _SC('=')) {
                Lex();
                val = ExpectScalar();
            }
            else {
                val._type = OT_INTEGER;
                val._unVal.nInteger = nval++;
            }
            _table(table)->NewSlot(SQObjectPtr(key),SQObjectPtr(val));
            if(_token == ',') Lex();
        }
        SQTable *enums = _table(_ss(_vm)->_consts);
        SQObjectPtr strongid = id;
        enums->NewSlot(SQObjectPtr(strongid),SQObjectPtr(table));
        strongid.Null();
        Lex();
    }